

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::jacobiEigenSolver<float>
               (Matrix44<float> *A,Vec4<float> *S,Matrix44<float> *V,float tol)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int i;
  long lVar3;
  float *pfVar4;
  int i_1;
  uint uVar5;
  bool bVar6;
  BaseType BVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_48 [5];
  float local_34;
  
  V->x[0][0] = 1.0;
  *(float *)((long)(V->x + 0) + 4) = 0.0;
  *(float *)((long)(V->x + 0) + 8) = 0.0;
  *(undefined8 *)(V->x[0] + 3) = 0;
  V->x[1][1] = 1.0;
  *(float *)((long)(V->x + 1) + 8) = 0.0;
  *(float *)((long)(V->x + 1) + 0xc) = 0.0;
  *(float *)((long)(V->x + 2) + 0) = 0.0;
  *(float *)((long)(V->x + 2) + 4) = 0.0;
  V->x[2][2] = 1.0;
  *(undefined8 *)(V->x[2] + 3) = 0;
  *(float *)((long)(V->x + 3) + 4) = 0.0;
  *(float *)((long)(V->x + 3) + 8) = 0.0;
  V->x[3][3] = 1.0;
  pfVar4 = (float *)A;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    (&S->x)[lVar3] = *pfVar4;
    pfVar4 = pfVar4 + 5;
  }
  local_48[4] = tol;
  BVar7 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix44<float>>(A);
  local_34 = BVar7 * local_48[4];
  if ((local_34 != 0.0) || (NAN(local_34))) {
    uVar5 = 0;
    do {
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      local_48[3] = 0.0;
      fVar12 = A->x[0][0];
      fVar11 = A->x[0][1];
      fVar9 = A->x[1][1];
      fVar8 = fVar9 - fVar12;
      if (ABS(fVar11 + fVar11) <= ABS(fVar8) * local_48[4]) {
        A->x[0][1] = 0.0;
      }
      else {
        fVar8 = fVar8 / (fVar11 + fVar11);
        fVar10 = *(float *)(&DAT_0014a120 + (ulong)(fVar8 < 0.0) * 4) /
                 (SQRT(fVar8 * fVar8 + 1.0) + ABS(fVar8));
        fVar8 = 1.0 / SQRT(fVar10 * fVar10 + 1.0);
        fVar11 = fVar11 * fVar10;
        fVar10 = fVar10 * fVar8;
        fVar8 = fVar10 / (fVar8 + 1.0);
        local_48[0] = 0.0 - fVar11;
        local_48[1] = fVar11 + 0.0;
        A->x[0][0] = fVar12 - fVar11;
        A->x[1][1] = fVar9 + fVar11;
        A->x[0][1] = 0.0;
        uVar1 = *(undefined8 *)(A->x[0] + 2);
        uVar2 = *(undefined8 *)(A->x[1] + 2);
        fVar11 = (float)uVar1;
        fVar9 = (float)((ulong)uVar1 >> 0x20);
        fVar12 = (float)uVar2;
        fVar13 = (float)((ulong)uVar2 >> 0x20);
        *(ulong *)(A->x[0] + 2) =
             CONCAT44(fVar9 - (fVar8 * fVar9 + fVar13) * fVar10,
                      fVar11 - (fVar8 * fVar11 + fVar12) * fVar10);
        *(ulong *)(A->x[1] + 2) =
             CONCAT44((fVar9 - fVar8 * fVar13) * fVar10 + fVar13,
                      (fVar11 - fVar8 * fVar12) * fVar10 + fVar12);
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
          uVar1 = *(undefined8 *)((long)V->x[0] + lVar3);
          fVar11 = (float)uVar1;
          fVar9 = (float)((ulong)uVar1 >> 0x20);
          *(ulong *)((long)V->x[0] + lVar3) =
               CONCAT44((-fVar8 * fVar9 + fVar11) * fVar10 + fVar9,
                        (fVar8 * fVar11 + fVar9) * -fVar10 + fVar11);
        }
        fVar12 = A->x[0][0];
      }
      fVar8 = local_48[1];
      fVar11 = A->x[0][2];
      fVar9 = A->x[2][2];
      fVar10 = fVar9 - fVar12;
      if (ABS(fVar11 + fVar11) <= ABS(fVar10) * local_48[4]) {
        A->x[0][2] = 0.0;
      }
      else {
        fVar10 = fVar10 / (fVar11 + fVar11);
        fVar10 = *(float *)(&DAT_0014a120 + (ulong)(fVar10 < 0.0) * 4) /
                 (SQRT(fVar10 * fVar10 + 1.0) + ABS(fVar10));
        fVar13 = 1.0 / SQRT(fVar10 * fVar10 + 1.0);
        fVar11 = fVar11 * fVar10;
        fVar10 = fVar10 * fVar13;
        local_48[0] = local_48[0] - fVar11;
        local_48[2] = fVar11 + 0.0;
        local_48[3] = 0.0;
        A->x[0][0] = fVar12 - fVar11;
        A->x[2][2] = fVar9 + fVar11;
        A->x[0][2] = 0.0;
        fVar13 = fVar10 / (fVar13 + 1.0);
        fVar11 = A->x[1][2];
        fVar9 = A->x[0][1];
        fVar12 = A->x[0][3];
        A->x[0][1] = fVar9 - (fVar13 * fVar9 + fVar11) * fVar10;
        A->x[1][2] = (fVar9 - fVar13 * fVar11) * fVar10 + fVar11;
        fVar11 = A->x[2][3];
        A->x[0][3] = fVar12 - (fVar13 * fVar12 + fVar11) * fVar10;
        A->x[2][3] = (fVar12 - fVar13 * fVar11) * fVar10 + fVar11;
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
          fVar11 = *(float *)((long)V->x[0] + lVar3);
          fVar9 = *(float *)((long)V->x[0] + lVar3 + 8);
          *(float *)((long)V->x[0] + lVar3) = (fVar13 * fVar11 + fVar9) * -fVar10 + fVar11;
          *(float *)((long)V->x[0] + lVar3 + 8) = (-fVar13 * fVar9 + fVar11) * fVar10 + fVar9;
        }
        fVar12 = A->x[0][0];
      }
      fVar10 = local_48[2];
      local_48[3] = 0.0;
      fVar11 = A->x[0][3];
      fVar9 = A->x[3][3];
      fVar13 = fVar9 - fVar12;
      if (ABS(fVar11 + fVar11) <= ABS(fVar13) * local_48[4]) {
        A->x[0][3] = 0.0;
      }
      else {
        fVar13 = fVar13 / (fVar11 + fVar11);
        fVar13 = *(float *)(&DAT_0014a120 + (ulong)(fVar13 < 0.0) * 4) /
                 (SQRT(fVar13 * fVar13 + 1.0) + ABS(fVar13));
        fVar14 = 1.0 / SQRT(fVar13 * fVar13 + 1.0);
        fVar11 = fVar11 * fVar13;
        fVar13 = fVar13 * fVar14;
        fVar14 = fVar13 / (fVar14 + 1.0);
        local_48[0] = local_48[0] - fVar11;
        local_48[3] = fVar11 + 0.0;
        A->x[0][0] = fVar12 - fVar11;
        A->x[3][3] = fVar9 + fVar11;
        A->x[0][3] = 0.0;
        fVar11 = A->x[1][3];
        fVar9 = A->x[2][3];
        uVar1 = *(undefined8 *)(A->x[0] + 1);
        fVar12 = (float)uVar1;
        A->x[1][3] = (fVar12 - fVar14 * fVar11) * fVar13 + fVar11;
        fVar15 = (float)((ulong)uVar1 >> 0x20);
        *(ulong *)(A->x[0] + 1) =
             CONCAT44(fVar15 - fVar13 * (fVar14 * fVar15 + fVar9),
                      fVar12 - fVar13 * (fVar14 * fVar12 + fVar11));
        A->x[2][3] = (fVar15 - fVar14 * fVar9) * fVar13 + fVar9;
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
          fVar11 = *(float *)((long)V->x[0] + lVar3);
          fVar9 = *(float *)((long)V->x[0] + lVar3 + 0xc);
          *(float *)((long)V->x[0] + lVar3) = (fVar14 * fVar11 + fVar9) * -fVar13 + fVar11;
          *(float *)((long)V->x[0] + lVar3 + 0xc) = (-fVar14 * fVar9 + fVar11) * fVar13 + fVar9;
        }
      }
      fVar13 = local_48[3];
      fVar12 = A->x[1][1];
      fVar11 = A->x[1][2];
      fVar9 = A->x[2][2];
      fVar14 = fVar9 - fVar12;
      if (ABS(fVar11 + fVar11) <= ABS(fVar14) * local_48[4]) {
        A->x[1][2] = 0.0;
      }
      else {
        fVar14 = fVar14 / (fVar11 + fVar11);
        fVar14 = *(float *)(&DAT_0014a120 + (ulong)(fVar14 < 0.0) * 4) /
                 (SQRT(fVar14 * fVar14 + 1.0) + ABS(fVar14));
        fVar15 = 1.0 / SQRT(fVar14 * fVar14 + 1.0);
        fVar11 = fVar11 * fVar14;
        fVar14 = fVar14 * fVar15;
        fVar8 = fVar8 - fVar11;
        local_48[1] = fVar8;
        fVar10 = fVar10 + fVar11;
        local_48[2] = fVar10;
        A->x[1][1] = fVar12 - fVar11;
        A->x[2][2] = fVar9 + fVar11;
        A->x[1][2] = 0.0;
        fVar12 = fVar14 / (fVar15 + 1.0);
        uVar1 = *(undefined8 *)(A->x[0] + 1);
        fVar11 = (float)uVar1;
        fVar9 = (float)((ulong)uVar1 >> 0x20);
        *(ulong *)(A->x[0] + 1) =
             CONCAT44((-fVar12 * fVar9 + fVar11) * fVar14 + fVar9,
                      (fVar12 * fVar11 + fVar9) * -fVar14 + fVar11);
        fVar11 = A->x[1][3];
        fVar9 = A->x[2][3];
        A->x[1][3] = fVar11 - (fVar12 * fVar11 + fVar9) * fVar14;
        A->x[2][3] = (fVar11 - fVar12 * fVar9) * fVar14 + fVar9;
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
          uVar1 = *(undefined8 *)((long)V->x[0] + lVar3 + 4);
          fVar11 = (float)uVar1;
          fVar9 = (float)((ulong)uVar1 >> 0x20);
          *(ulong *)((long)V->x[0] + lVar3 + 4) =
               CONCAT44((-fVar12 * fVar9 + fVar11) * fVar14 + fVar9,
                        (fVar12 * fVar11 + fVar9) * -fVar14 + fVar11);
        }
        fVar12 = A->x[1][1];
      }
      fVar11 = A->x[1][3];
      fVar9 = A->x[3][3];
      if (ABS(fVar11 + fVar11) <= ABS(fVar9 - fVar12) * local_48[4]) {
        A->x[1][3] = 0.0;
      }
      else {
        fVar14 = (fVar9 - fVar12) / (fVar11 + fVar11);
        fVar14 = *(float *)(&DAT_0014a120 + (ulong)(fVar14 < 0.0) * 4) /
                 (SQRT(fVar14 * fVar14 + 1.0) + ABS(fVar14));
        fVar15 = 1.0 / SQRT(fVar14 * fVar14 + 1.0);
        fVar11 = fVar11 * fVar14;
        fVar14 = fVar14 * fVar15;
        local_48[1] = fVar8 - fVar11;
        fVar13 = fVar13 + fVar11;
        local_48[3] = fVar13;
        A->x[1][1] = fVar12 - fVar11;
        A->x[3][3] = fVar9 + fVar11;
        A->x[1][3] = 0.0;
        fVar12 = fVar14 / (fVar15 + 1.0);
        fVar11 = A->x[0][1];
        fVar9 = A->x[0][3];
        A->x[0][1] = fVar11 - (fVar12 * fVar11 + fVar9) * fVar14;
        A->x[0][3] = (fVar11 - fVar12 * fVar9) * fVar14 + fVar9;
        fVar11 = A->x[1][2];
        fVar9 = A->x[2][3];
        A->x[1][2] = fVar11 - (fVar12 * fVar11 + fVar9) * fVar14;
        A->x[2][3] = (fVar11 - fVar12 * fVar9) * fVar14 + fVar9;
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
          fVar11 = *(float *)((long)V->x[0] + lVar3 + 4);
          fVar9 = *(float *)((long)V->x[0] + lVar3 + 0xc);
          *(float *)((long)V->x[0] + lVar3 + 4) = (fVar12 * fVar11 + fVar9) * -fVar14 + fVar11;
          *(float *)((long)V->x[0] + lVar3 + 0xc) = (-fVar12 * fVar9 + fVar11) * fVar14 + fVar9;
        }
        fVar9 = A->x[3][3];
      }
      fVar11 = A->x[2][2];
      fVar12 = A->x[2][3];
      fVar8 = fVar9 - fVar11;
      if (ABS(fVar12 + fVar12) <= ABS(fVar8) * local_48[4]) {
        A->x[2][3] = 0.0;
      }
      else {
        fVar8 = fVar8 / (fVar12 + fVar12);
        fVar14 = *(float *)(&DAT_0014a120 + (ulong)(fVar8 < 0.0) * 4) /
                 (SQRT(fVar8 * fVar8 + 1.0) + ABS(fVar8));
        fVar8 = 1.0 / SQRT(fVar14 * fVar14 + 1.0);
        fVar12 = fVar12 * fVar14;
        fVar14 = fVar14 * fVar8;
        local_48[2] = fVar10 - fVar12;
        local_48[3] = fVar13 + fVar12;
        A->x[2][2] = fVar11 - fVar12;
        A->x[3][3] = fVar9 + fVar12;
        A->x[2][3] = 0.0;
        fVar11 = -fVar14;
        fVar10 = fVar14 / (fVar8 + 1.0);
        fVar9 = -fVar10;
        uVar1 = *(undefined8 *)(A->x[0] + 2);
        fVar12 = (float)uVar1;
        fVar8 = (float)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)(A->x[1] + 2);
        *(ulong *)(A->x[0] + 2) =
             CONCAT44((fVar9 * fVar8 + fVar12) * fVar14 + fVar8,
                      (fVar10 * fVar12 + fVar8) * fVar11 + fVar12);
        fVar12 = (float)uVar1;
        fVar8 = (float)((ulong)uVar1 >> 0x20);
        *(ulong *)(A->x[1] + 2) =
             CONCAT44((fVar9 * fVar8 + fVar12) * fVar14 + fVar8,
                      (fVar10 * fVar12 + fVar8) * fVar11 + fVar12);
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
          uVar1 = *(undefined8 *)((long)V->x[0] + lVar3 + 8);
          fVar12 = (float)uVar1;
          fVar8 = (float)((ulong)uVar1 >> 0x20);
          *(ulong *)((long)V->x[0] + lVar3 + 8) =
               CONCAT44((fVar9 * fVar8 + fVar12) * fVar14 + fVar8,
                        (fVar10 * fVar12 + fVar8) * fVar11 + fVar12);
        }
      }
      pfVar4 = (float *)A;
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        fVar11 = local_48[lVar3] + (&S->x)[lVar3];
        (&S->x)[lVar3] = fVar11;
        *pfVar4 = fVar11;
        pfVar4 = pfVar4 + 5;
      }
      BVar7 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix44<float>>(A);
    } while ((local_34 < BVar7) && (bVar6 = uVar5 < 0x13, uVar5 = uVar5 + 1, bVar6));
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix44<T>& A, Vec4<T>& S, Matrix44<T>& V, const T tol)
{
    V.makeIdentity ();

    for (int i = 0; i < 4; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            Vec4<T> Z (0, 0, 0, 0);
            bool    changed = jacobiRotation<0, 1, 2, 3> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<0, 3, 1, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 3, 0, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<2, 3, 0, 1> (A, V, Z, tol) || changed;
            for (int i = 0; i < 4; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}